

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O0

void __thiscall QHostAddress::setScopeId(QHostAddress *this,QString *id)

{
  QHostAddressPrivate *pQVar1;
  QString *in_RSI;
  QExplicitlySharedDataPointer<QHostAddressPrivate> *in_stack_ffffffffffffffe0;
  
  QExplicitlySharedDataPointer<QHostAddressPrivate>::detach(in_stack_ffffffffffffffe0);
  pQVar1 = QExplicitlySharedDataPointer<QHostAddressPrivate>::operator->
                     ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)0x2173bb);
  if (pQVar1->protocol == '\x01') {
    pQVar1 = QExplicitlySharedDataPointer<QHostAddressPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)0x2173d8);
    QString::operator=(&pQVar1->scopeId,in_RSI);
  }
  return;
}

Assistant:

void QHostAddress::setScopeId(const QString &id)
{
    d.detach();
    if (d->protocol == QHostAddress::IPv6Protocol)
        d->scopeId = id;
}